

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cc
# Opt level: O2

void ctemplate_htmlparser::statemachine_set_state(statemachine_ctx *ctx,int state)

{
  int iVar1;
  statemachine_definition *psVar2;
  int iVar3;
  
  if (ctx == (statemachine_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                  ,0xb6,"void ctemplate_htmlparser::statemachine_set_state(statemachine_ctx *, int)"
                 );
  }
  psVar2 = ctx->definition;
  if (psVar2 != (statemachine_definition *)0x0) {
    if (state < psVar2->num_states) {
      ctx->next_state = state;
      iVar1 = ctx->current_state;
      if (iVar1 != state) {
        iVar3 = state;
        if (psVar2->exit_state_events[iVar1] != (state_event_function)0x0) {
          (*psVar2->exit_state_events[iVar1])(ctx,iVar1,'\0',state);
          iVar3 = ctx->next_state;
        }
        if (psVar2->enter_state_events[iVar3] != (state_event_function)0x0) {
          (*psVar2->enter_state_events[iVar3])(ctx,ctx->current_state,'\0',iVar3);
        }
      }
      ctx->current_state = state;
      return;
    }
    __assert_fail("state < def->num_states",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                  ,0xbb,"void ctemplate_htmlparser::statemachine_set_state(statemachine_ctx *, int)"
                 );
  }
  __assert_fail("ctx->definition != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                ,0xb7,"void ctemplate_htmlparser::statemachine_set_state(statemachine_ctx *, int)");
}

Assistant:

void statemachine_set_state(statemachine_ctx *ctx, int state)
{

  statemachine_definition *def;

  assert(ctx != NULL);
  assert(ctx->definition != NULL);

  def = ctx->definition;

  assert(state < def->num_states);

  ctx->next_state = state;

  if (ctx->current_state != ctx->next_state) {
    if (def->exit_state_events[ctx->current_state])
       def->exit_state_events[ctx->current_state](ctx,
                                                 ctx->current_state,
                                                 '\0',
                                                 ctx->next_state);

    if (def->enter_state_events[ctx->next_state])
       def->enter_state_events[ctx->next_state](ctx,
                                               ctx->current_state,
                                               '\0',
                                               ctx->next_state);
  }

  ctx->current_state = state;
}